

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::ScriptWitness::Serialize(ByteData *__return_storage_ptr__,ScriptWitness *this)

{
  ByteData *stack;
  pointer pBVar1;
  pointer pBVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> buffer_array;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work_buffer;
  ByteData stack_count;
  ByteData local_98;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ByteData local_40;
  
  local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (ByteData *)0x0;
  local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (ByteData *)0x0;
  local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::GetVariableInt
            (&local_40,
             ((long)(this->witness_stack_).
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->witness_stack_).
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&local_78,&local_40);
  pBVar1 = (this->witness_stack_).
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2 = (this->witness_stack_).
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar1 != pBVar2) {
    do {
      ByteData::Serialize(&local_98,pBVar1);
      ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>(&local_78,&local_98);
      if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pBVar1 = pBVar1 + 1;
    } while (pBVar1 != pBVar2);
  }
  pBVar1 = local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    pBVar2 = local_78.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      ByteData::GetBytes(&local_58,pBVar2);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_98,
                 local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pBVar2 = pBVar2 + 1;
    } while (pBVar2 != pBVar1);
  }
  ByteData::ByteData(__return_storage_ptr__,&local_98.data_);
  if (local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

ByteData ScriptWitness::Serialize() const {
  std::vector<ByteData> buffer_array;
  ByteData stack_count = ByteData::GetVariableInt(witness_stack_.size());
  buffer_array.push_back(stack_count);
  for (const ByteData &stack : witness_stack_) {
    buffer_array.push_back(stack.Serialize());
  }

  std::vector<uint8_t> result;
  for (const ByteData &buffer : buffer_array) {
    std::vector<uint8_t> work_buffer = buffer.GetBytes();
    result.insert(result.end(), work_buffer.begin(), work_buffer.end());
  }
  return ByteData(result);
}